

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O0

bool tinyjson::atod(char *s,char *s_end,double *result)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  __type _Var6;
  double local_78;
  bool local_61;
  double local_60;
  bool local_4e;
  bool local_4d;
  int lut_entries;
  bool leading_decimal_dots;
  bool end_not_reached;
  char *pcStack_40;
  int read;
  char *curr;
  char exp_sign;
  char sign;
  double dStack_30;
  int exponent;
  double mantissa;
  double *result_local;
  char *s_end_local;
  char *s_local;
  
  if (s_end <= s) {
    return false;
  }
  dStack_30 = 0.0;
  curr._4_4_ = 0;
  curr._3_1_ = '+';
  curr._2_1_ = '+';
  lut_entries = 0;
  bVar2 = false;
  if ((*s == '+') || (*s == '-')) {
    curr._3_1_ = *s;
    pcStack_40 = s + 1;
    if ((pcStack_40 != s_end) && (*pcStack_40 == '.')) {
      bVar2 = true;
    }
LAB_00104060:
    bVar5 = pcStack_40 != s_end;
    if (!bVar2) {
      while( true ) {
        local_4d = false;
        if (bVar5) {
          local_4d = is_digit(*pcStack_40);
        }
        if (local_4d == false) break;
        dStack_30 = (double)(*pcStack_40 + -0x30) + dStack_30 * 10.0;
        pcStack_40 = pcStack_40 + 1;
        lut_entries = lut_entries + 1;
        bVar5 = pcStack_40 != s_end;
      }
      if (lut_entries == 0) goto LAB_001043cb;
    }
    if (bVar5) {
      if (*pcStack_40 == '.') {
        lut_entries = 1;
        while( true ) {
          pcStack_40 = pcStack_40 + 1;
          bVar5 = pcStack_40 != s_end;
          local_4e = false;
          if (bVar5) {
            local_4e = is_digit(*pcStack_40);
          }
          if (local_4e == false) break;
          cVar1 = *pcStack_40;
          if (lut_entries < 8) {
            local_60 = atod::pow_lut[lut_entries];
          }
          else {
            local_60 = std::pow<double,int>(10.0,-lut_entries);
          }
          dStack_30 = (double)(cVar1 + -0x30) * local_60 + dStack_30;
          lut_entries = lut_entries + 1;
        }
      }
      else if ((*pcStack_40 != 'e') && (*pcStack_40 != 'E')) goto LAB_0010434d;
      if ((bVar5) && ((*pcStack_40 == 'e' || (*pcStack_40 == 'E')))) {
        pcVar4 = pcStack_40 + 1;
        if ((pcVar4 == s_end) || ((*pcVar4 != '+' && (*pcVar4 != '-')))) {
          bVar2 = is_digit(*pcVar4);
          pcStack_40 = pcVar4;
          if (!bVar2) goto LAB_001043cb;
        }
        else {
          curr._2_1_ = *pcVar4;
          pcStack_40 = pcStack_40 + 2;
        }
        lut_entries = 0;
        while( true ) {
          local_61 = false;
          if (pcStack_40 != s_end) {
            local_61 = is_digit(*pcStack_40);
          }
          if (local_61 == false) break;
          curr._4_4_ = *pcStack_40 + -0x30 + curr._4_4_ * 10;
          pcStack_40 = pcStack_40 + 1;
          lut_entries = lut_entries + 1;
        }
        iVar3 = -1;
        if (curr._2_1_ == '+') {
          iVar3 = 1;
        }
        curr._4_4_ = iVar3 * curr._4_4_;
        if (lut_entries == 0) goto LAB_001043cb;
      }
    }
LAB_0010434d:
    iVar3 = -1;
    if (curr._3_1_ == '+') {
      iVar3 = 1;
    }
    if (curr._4_4_ == 0) {
      local_78 = dStack_30;
    }
    else {
      _Var6 = std::pow<double,int>(5.0,curr._4_4_);
      local_78 = ldexp(dStack_30 * _Var6,curr._4_4_);
    }
    *result = (double)iVar3 * local_78;
    s_local._7_1_ = true;
  }
  else {
    bVar5 = is_digit(*s);
    pcStack_40 = s;
    if (bVar5) goto LAB_00104060;
    if (*s == '.') {
      bVar2 = true;
      goto LAB_00104060;
    }
LAB_001043cb:
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool atod(const char *s, const char *s_end, double *result) {
    if (s >= s_end) {
      return false;
    }

    double mantissa = 0.0;
    // This exponent is base 2 rather than 10.
    // However the exponent we parse is supposed to be one of ten,
    // thus we must take care to convert the exponent/and or the
    // mantissa to a * 2^E, where a is the mantissa and E is the
    // exponent.
    // To get the final double we will use ldexp, it requires the
    // exponent to be in base 2.
    int exponent = 0;

    // NOTE: THESE MUST BE DECLARED HERE SINCE WE ARE NOT ALLOWED
    // TO JUMP OVER DEFINITIONS.
    char sign = '+';
    char exp_sign = '+';
    char const *curr = s;

    // How many characters were read in a loop.
    int read = 0;
    // Tells whether a loop terminated due to reaching s_end.
    bool end_not_reached = false;
    bool leading_decimal_dots = false;

    /*
            BEGIN PARSING.
    */

    // Find out what sign we've got.
    if (*curr == '+' || *curr == '-') {
      sign = *curr;
      curr++;
      if ((curr != s_end) && (*curr == '.')) {
        // accept. Somethig like `.7e+2`, `-.5234`
        leading_decimal_dots = true;
      }
    } else if (is_digit(*curr)) { /* Pass through. */
    } else if (*curr == '.') {
      // accept. Somethig like `.7e+2`, `-.5234`
      leading_decimal_dots = true;
    } else {
      goto fail;
    }

    // Read the integer part.
    end_not_reached = (curr != s_end);
    if (!leading_decimal_dots) {
      while (end_not_reached && is_digit(*curr)) {
        mantissa *= 10;
        mantissa += static_cast<int>(*curr - 0x30);
        curr++;
        read++;
        end_not_reached = (curr != s_end);
      }

      // We must make sure we actually got something.
      if (read == 0) goto fail;
    }

    // We allow numbers of form "#", "###" etc.
    if (!end_not_reached) goto assemble;

    // Read the decimal part.
    if (*curr == '.') {
      curr++;
      read = 1;
      end_not_reached = (curr != s_end);
      while (end_not_reached && is_digit(*curr)) {
        static const double pow_lut[] = {
                1.0, 0.1, 0.01, 0.001, 0.0001, 0.00001, 0.000001, 0.0000001,
        };
        const int lut_entries = sizeof pow_lut / sizeof pow_lut[0];

        // NOTE: Don't use powf here, it will absolutely murder precision.
        mantissa += static_cast<int>(*curr - 0x30) *
                    (read < lut_entries ? pow_lut[read] : std::pow(10.0, -read));
        read++;
        curr++;
        end_not_reached = (curr != s_end);
      }
    } else if (*curr == 'e' || *curr == 'E') {
    } else {
      goto assemble;
    }

    if (!end_not_reached) goto assemble;

    // Read the exponent part.
    if (*curr == 'e' || *curr == 'E') {
      curr++;
      // Figure out if a sign is present and if it is.
      end_not_reached = (curr != s_end);
      if (end_not_reached && (*curr == '+' || *curr == '-')) {
        exp_sign = *curr;
        curr++;
      } else if (is_digit(*curr)) { /* Pass through. */
      } else {
        // Empty E is not allowed.
        goto fail;
      }

      read = 0;
      end_not_reached = (curr != s_end);
      while (end_not_reached && is_digit(*curr)) {
        exponent *= 10;
        exponent += static_cast<int>(*curr - 0x30);
        curr++;
        read++;
        end_not_reached = (curr != s_end);
      }
      exponent *= (exp_sign == '+' ? 1 : -1);
      if (read == 0) goto fail;
    }

    assemble:
    *result = (sign == '+' ? 1 : -1) *
              (exponent ? std::ldexp(mantissa * std::pow(5.0, exponent), exponent)
                        : mantissa);
    return true;
    fail:
    return false;
  }